

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString_abi_cxx11_(Catch *this,wchar_t *value)

{
  allocator local_4e;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  wstring local_38 [32];
  wchar_t *local_18;
  wchar_t *value_local;
  
  local_3a = 0;
  local_4d = 0;
  local_18 = value;
  value_local = (wchar_t *)this;
  if (value == (wchar_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"{null string}",&local_4e);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  }
  else {
    std::allocator<wchar_t>::allocator();
    local_3a = 1;
    std::__cxx11::wstring::wstring(local_38,value,&local_39);
    local_4d = 1;
    toString(this,(wstring *)local_38);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::wstring::~wstring(local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_39);
  }
  return this;
}

Assistant:

std::string toString( const wchar_t* const value )
{
	return value ? Catch::toString( std::wstring(value) ) : std::string( "{null string}" );
}